

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O1

void __thiscall
TEST_MockReturnValueTest_WhenNoUnsignedIntegerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
::testBody(TEST_MockReturnValueTest_WhenNoUnsignedIntegerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
           *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  UtestShell *pUVar4;
  undefined4 extraout_var;
  TestTerminator *pTVar5;
  SimpleString local_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_38,"");
  pMVar3 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"");
  pMVar3 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_28);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x118))
                    ((long *)CONCAT44(extraout_var,iVar1),10);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,10,(ulong)uVar2,
             "LONGS_EQUAL(default_return_value, mock().actualCall(\"foo\").returnUnsignedIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xf9,pTVar5);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"");
  pMVar3 = mock(&local_38,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x16])(pMVar3,10);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,10,(ulong)uVar2,
             "LONGS_EQUAL(default_return_value, mock().returnUnsignedIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xfa,pTVar5);
  SimpleString::~SimpleString(&local_38);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenNoUnsignedIntegerReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue)
{
    unsigned int default_return_value = 10;
    mock().expectOneCall("foo");
    LONGS_EQUAL(default_return_value, mock().actualCall("foo").returnUnsignedIntValueOrDefault(default_return_value));
    LONGS_EQUAL(default_return_value, mock().returnUnsignedIntValueOrDefault(default_return_value));
}